

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

INT MAPProtectionToFileOpenFlags(DWORD flProtect)

{
  INT local_10;
  INT retVal;
  DWORD flProtect_local;
  
  if (flProtect == 2) {
    local_10 = 0;
  }
  else if (flProtect == 4) {
    local_10 = 2;
  }
  else if (flProtect == 8) {
    local_10 = 0;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","MAPProtectionToFileOpenFlags",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x780);
    fprintf(_stderr,"unexpected flProtect value %#x\n",(ulong)flProtect);
    local_10 = 0;
  }
  return local_10;
}

Assistant:

static INT MAPProtectionToFileOpenFlags( DWORD flProtect )
{
    INT retVal = 0;
    switch(flProtect)
    {
    case PAGE_READONLY:
        retVal = O_RDONLY;
        break;
    case PAGE_READWRITE:
        retVal = O_RDWR;
        break;
    case PAGE_WRITECOPY:
        retVal = O_RDONLY;
        break;
    default:
        ASSERT("unexpected flProtect value %#x\n", flProtect);
        retVal = 0;
        break;
    }         
    return retVal;
}